

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d63_qx_inside_interval.cpp
# Opt level: O3

int main(void)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  mapped_type mVar3;
  istream *piVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  _Self __tmp;
  _Rb_tree_node_base *p_Var7;
  bool bVar8;
  int a;
  int b;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> d;
  _Rb_tree_color local_70;
  int local_6c;
  mapped_type local_68;
  int local_64;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105180) = 0;
  piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_64);
  std::istream::operator>>(piVar4,&local_6c);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Rb_tree_node_base *)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar8 = local_64 != 0;
  local_64 = local_64 + -1;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (bVar8) {
    do {
      piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)&local_70);
      std::istream::operator>>(piVar4,&local_68);
      mVar3 = local_68;
      pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_60,(key_type *)&local_70);
      *pmVar5 = mVar3;
      bVar8 = local_64 != 0;
      local_64 = local_64 + -1;
    } while (bVar8);
  }
  bVar8 = local_6c != 0;
  local_6c = local_6c + -1;
  if (bVar8) {
    do {
      std::istream::operator>>((istream *)&std::cin,(int *)&local_70);
      p_Var7 = &p_Var1->_M_header;
      for (p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var2 != (_Rb_tree_node_base *)0x0;
          p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < (int)local_70]) {
        if ((int)local_70 <= (int)p_Var2[1]._M_color) {
          p_Var7 = p_Var2;
        }
      }
      if (p_Var7[1]._M_color == local_70) {
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
LAB_001013c7:
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      }
      else if ((_Rb_tree_header *)p_Var7 == p_Var1 || (int)local_70 < (int)p_Var7[1]._M_color) {
        std::_Rb_tree_decrement(p_Var7);
        poVar6 = std::ostream::_M_insert<bool>(true);
        goto LAB_001013c7;
      }
      bVar8 = local_6c != 0;
      local_6c = local_6c + -1;
    } while (bVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);

    int m, n;
    cin >> m >> n;
    map<int, int> d;

    while (m--) {
        int a, b;
        cin >> a >> b;

        d[a] = b;
    }

    while (n--) {
        int x;
        cin >> x;
        auto it = d.lower_bound(x);
        if (it->first == x) {
            cout << 1 << " ";
        } else if (it == d.end() || it->first > x) {
            it--;
            cout << check_range(it, x) << " ";
        }
    }
    cout << "\n";
}